

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::createAccessChain(Builder *this,StorageClass storageClass,Id base,Vector<Id> *offsets)

{
  pointer ppIVar1;
  iterator iVar2;
  Block *pBVar3;
  uint uVar4;
  Id IVar5;
  Id IVar6;
  Instruction *pIVar7;
  pointer puVar8;
  uint member;
  long lVar9;
  Instruction *raw_instruction;
  uint local_3c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ppIVar1[base]->typeId;
  if ((ppIVar1[uVar4]->opCode == OpTypePointer) &&
     ((offsets->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (offsets->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start)) {
    uVar4 = getContainedTypeId(this,uVar4,0);
    puVar8 = (offsets->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(offsets->
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar8) >> 2)) {
      lVar9 = 0;
      do {
        ppIVar1 = (this->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        member = puVar8[lVar9];
        if (ppIVar1[uVar4]->opCode == OpTypeStruct) {
          pIVar7 = ppIVar1[member];
          if (pIVar7->opCode != OpConstant) {
            __assert_fail("isConstantScalar(offsets[i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                          ,0x509,
                          "Id spv::Builder::createAccessChain(StorageClass, Id, const dxil_spv::Vector<Id> &)"
                         );
          }
          member = *(pIVar7->operands).
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        uVar4 = getContainedTypeId(this,uVar4,member);
        lVar9 = lVar9 + 1;
        puVar8 = (offsets->
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (lVar9 < (int)((ulong)((long)(offsets->
                                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar8) >> 2));
    }
    IVar5 = makePointer(this,storageClass,uVar4);
    pIVar7 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar6 = this->uniqueId + 1;
    this->uniqueId = IVar6;
    pIVar7->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    pIVar7->resultId = IVar6;
    pIVar7->typeId = IVar5;
    pIVar7->opCode = OpAccessChain;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar7->block = (Block *)0x0;
    iVar2._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_3c = base;
    if (iVar2._M_current ==
        (pIVar7->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar7->operands,iVar2,&local_3c);
    }
    else {
      *iVar2._M_current = base;
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    puVar8 = (offsets->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(offsets->
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar8) >> 2)) {
      lVar9 = 0;
      do {
        local_3c = puVar8[lVar9];
        iVar2._M_current =
             (pIVar7->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (pIVar7->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                     &pIVar7->operands,iVar2,&local_3c);
        }
        else {
          *iVar2._M_current = local_3c;
          (pIVar7->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        lVar9 = lVar9 + 1;
        puVar8 = (offsets->
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (lVar9 < (int)((ulong)((long)(offsets->
                                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar8) >> 2));
    }
    pBVar3 = this->buildPoint;
    local_38._M_head_impl = pIVar7;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar3->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
    pIVar7->block = pBVar3;
    if (pIVar7->resultId != 0) {
      Module::mapInstruction(pBVar3->parent->parent,pIVar7);
    }
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    return pIVar7->resultId;
  }
  __assert_fail("isPointerType(typeId) && offsets.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x505,
                "Id spv::Builder::createAccessChain(StorageClass, Id, const dxil_spv::Vector<Id> &)"
               );
}

Assistant:

Id Builder::createAccessChain(StorageClass storageClass, Id base, const dxil_spv::Vector<Id>& offsets)
{
    // Figure out the final resulting type.
    spv::Id typeId = getTypeId(base);
    assert(isPointerType(typeId) && offsets.size() > 0);
    typeId = getContainedTypeId(typeId);
    for (int i = 0; i < (int)offsets.size(); ++i) {
        if (isStructType(typeId)) {
            assert(isConstantScalar(offsets[i]));
            typeId = getContainedTypeId(typeId, getConstantScalar(offsets[i]));
        } else
            typeId = getContainedTypeId(typeId, offsets[i]);
    }
    typeId = makePointer(storageClass, typeId);

    // Make the instruction
    Instruction* chain = new Instruction(getUniqueId(), typeId, OpAccessChain);
    chain->addIdOperand(base);
    for (int i = 0; i < (int)offsets.size(); ++i)
        chain->addIdOperand(offsets[i]);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(chain));

    return chain->getResultId();
}